

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionRayleighAdvancedGeneric::ComputeQuadraticTerms
          (ChBeamSectionRayleighAdvancedGeneric *this,ChVector<double> *mF,ChVector<double> *mT,
          ChVector<double> *mW)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  dVar1 = mW->m_data[2];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar1;
  dVar2 = (this->super_ChBeamSectionEulerAdvancedGeneric).My;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar2;
  dVar8 = (this->super_ChBeamSectionEulerAdvancedGeneric).Mz;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar8;
  dVar3 = mW->m_data[0];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar3;
  dVar4 = mW->m_data[1];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar4;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar2 * dVar1;
  auVar7 = vfmsub231sd_fma(auVar26,auVar18,auVar12);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar8 * dVar3;
  auVar5 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar9,auVar20);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar4 * -0.0;
  auVar12 = vfmadd231sd_fma(auVar27,auVar16,auVar24);
  dVar2 = (this->super_ChBeamSectionEulerAdvancedGeneric).mu;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = auVar7._0_8_ * dVar4;
  auVar6 = vfmsub231sd_fma(auVar13,auVar16,auVar5);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = auVar12._0_8_ * dVar3;
  auVar7 = vfmsub231sd_fma(auVar17,auVar9,auVar7);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = auVar5._0_8_ * dVar1;
  auVar12 = vfmsub231sd_fma(auVar10,auVar18,auVar12);
  dVar8 = dVar2 * auVar12._0_8_;
  mF->m_data[0] = dVar8;
  mF->m_data[1] = dVar2 * auVar7._0_8_;
  mF->m_data[2] = dVar2 * auVar6._0_8_;
  (*(this->super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[0xc])();
  dVar1 = (this->super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.JzzJyy_factor;
  auVar21._8_8_ = dVar1;
  auVar21._0_8_ = dVar1;
  dVar1 = (this->super_ChBeamSectionEulerAdvancedGeneric).mu;
  auVar22._8_8_ = dVar1;
  auVar22._0_8_ = dVar1;
  auVar12 = *(undefined1 (*) [16])(mW->m_data + 1);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = mW->m_data[0];
  auVar25._8_8_ = mW->m_data[2];
  auVar25._0_8_ = mW->m_data[2];
  auVar5._0_8_ = this->Jzz;
  auVar5._8_8_ = this->Jyy;
  auVar5 = vfmadd213pd_fma(auVar22,auVar21,auVar5);
  dVar8 = dVar8 * mW->m_data[0];
  auVar5 = vshufpd_avx(auVar5,auVar5,1);
  auVar6._8_8_ = 0x8000000000000000;
  auVar6._0_8_ = 0x8000000000000000;
  auVar7._8_8_ = this->Jyz;
  auVar7._0_8_ = this->Jyz;
  auVar7 = vxorpd_avx512vl(auVar6,auVar7);
  auVar23._0_8_ = auVar12._0_8_ * auVar7._0_8_;
  auVar23._8_8_ = auVar12._8_8_ * auVar7._8_8_;
  auVar7 = vshufpd_avx(auVar23,auVar23,1);
  auVar6 = vfmadd231pd_fma(auVar7,auVar12,auVar5);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar8 * auVar12._0_8_;
  auVar9 = vfmsub231sd_fma(auVar19,auVar14,auVar6);
  auVar7 = vunpcklpd_avx(auVar25,auVar14);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar8;
  auVar5 = vshufpd_avx(auVar6,auVar11,1);
  auVar15._0_8_ = auVar6._0_8_ * auVar7._0_8_;
  auVar15._8_8_ = auVar6._8_8_ * auVar7._8_8_;
  auVar12 = vfmsub213pd_fma(auVar5,auVar12,auVar15);
  *(undefined1 (*) [16])mT->m_data = auVar12;
  mT->m_data[2] = auVar9._0_8_;
  return;
}

Assistant:

void ChBeamSectionRayleighAdvancedGeneric::ComputeQuadraticTerms(ChVector<>& mF,   ///< centrifugal term (if any) returned here
		ChVector<>& mT,                ///< gyroscopic term  returned here
		const ChVector<>& mW           ///< current angular velocity of section, in material frame
	) {
		 // F_centrifugal = density_per_unit_length w X w X c 
		mF = this->mu * Vcross(mW,Vcross(mW,ChVector<>(0,this->My,this->Mz)));

		// unroll the product [J] * w  in the expression w X [J] * w  as 4 values of [J] are zero anyway
		mT = Vcross(mW, ChVector<>( this->GetInertiaJxxPerUnitLength()*mW.x(),
									(this->Jyy + JzzJyy_factor * this->mu)*mW.y() - this->Jyz*mW.z(),
									(this->Jzz + JzzJyy_factor * this->mu)*mW.z() - this->Jyz*mW.y() )  );
	}